

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::TokenManager::GetKeyId
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aKeyId,CborMap *aToken)

{
  string *this_00;
  ErrorCode EVar1;
  pointer puVar2;
  uint8_t *keyId;
  size_t keyIdLength;
  CborMap coseKey;
  CborMap cnf;
  allocator_type local_a1;
  uint8_t *local_a0;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  pointer local_88;
  uchar local_80 [16];
  ByteArray *local_70;
  size_t local_68;
  CborValue local_60;
  CborValue local_48;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborValue::CborValue(&local_48);
  local_48._vptr_CborValue = (_func_int **)&PTR__CborValue_00293c78;
  CborValue::CborValue(&local_60);
  local_60._vptr_CborValue = (_func_int **)&PTR__CborValue_00293c78;
  local_a0 = (uchar *)0x0;
  local_70 = aKeyId;
  CborMap::Get((Error *)local_98,aToken,8,(CborMap *)&local_48);
  __return_storage_ptr__->mCode = local_98._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_90);
  EVar1 = __return_storage_ptr__->mCode;
  if ((uchar *)_Stack_90._M_p != local_80) {
    operator_delete(_Stack_90._M_p);
  }
  if (EVar1 == kNone) {
    CborMap::Get((Error *)local_98,(CborMap *)&local_48,1,(CborMap *)&local_60);
    __return_storage_ptr__->mCode = local_98._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_90);
    EVar1 = __return_storage_ptr__->mCode;
    if ((uchar *)_Stack_90._M_p != local_80) {
      operator_delete(_Stack_90._M_p);
    }
    if (EVar1 == kNone) {
      CborMap::Get((Error *)local_98,(CborMap *)&local_60,2,&local_a0,&local_68);
      __return_storage_ptr__->mCode = local_98._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_90);
      EVar1 = __return_storage_ptr__->mCode;
      if ((uchar *)_Stack_90._M_p != local_80) {
        operator_delete(_Stack_90._M_p);
      }
      if (EVar1 == kNone) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_98,local_a0,
                   local_a0 + local_68,&local_a1);
        puVar2 = (local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        (local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_98;
        (local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)_Stack_90._M_p;
        (local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_88;
        local_98 = (undefined1  [8])0x0;
        _Stack_90._M_p = (pointer)0x0;
        local_88 = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        if (local_98 != (undefined1  [8])0x0) {
          operator_delete((void *)local_98);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetKeyId(ByteArray &aKeyId, const CborMap &aToken) const
{
    Error          error;
    CborMap        cnf;
    CborMap        coseKey;
    const uint8_t *keyId = nullptr;
    size_t         keyIdLength;

    SuccessOrExit(error = aToken.Get(cwt::kCnf, cnf));
    SuccessOrExit(error = cnf.Get(cwt::kCoseKey, coseKey));
    SuccessOrExit(error = coseKey.Get(cose::kKeyId, keyId, keyIdLength));

    aKeyId = {keyId, keyId + keyIdLength};

exit:
    return error;
}